

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcolsetbase.h
# Opt level: O2

int __thiscall soplex::LPColSetBase<double>::remove(LPColSetBase<double> *this,char *__filename)

{
  uint uVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  int *piVar5;
  int extraout_EAX;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar1 = (this->super_SVSetBase<double>).set.thenum;
  SVSetBase<double>::remove(&this->super_SVSetBase<double>,__filename);
  pdVar2 = (this->low).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->up).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (this->object).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (this->scaleExp).data;
  uVar6 = 0;
  uVar8 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar8 = uVar6;
  }
  for (; uVar8 != uVar6; uVar6 = uVar6 + 1) {
    uVar7 = (ulong)*(uint *)(__filename + uVar6 * 4);
    if (uVar6 != uVar7 && -1 < (int)*(uint *)(__filename + uVar6 * 4)) {
      pdVar2[uVar7] = pdVar2[uVar6];
      pdVar3[uVar7] = pdVar3[uVar6];
      pdVar4[uVar7] = pdVar4[uVar6];
      piVar5[uVar7] = piVar5[uVar6];
    }
  }
  VectorBase<double>::reDim(&this->low,(this->super_SVSetBase<double>).set.thenum,true);
  VectorBase<double>::reDim(&this->up,(this->super_SVSetBase<double>).set.thenum,true);
  VectorBase<double>::reDim(&this->object,(this->super_SVSetBase<double>).set.thenum,true);
  DataArray<int>::reSize(&this->scaleExp,(this->super_SVSetBase<double>).set.thenum);
  return extraout_EAX;
}

Assistant:

void remove(int perm[])
   {
      int n = num();

      SVSetBase<R>::remove(perm);

      for(int i = 0; i < n; ++i)
      {
         if(perm[i] >= 0 && perm[i] != i)
         {
            low[perm[i]] = low[i];
            up[perm[i]] = up[i];
            object[perm[i]] = object[i];
            scaleExp[perm[i]] = scaleExp[i];
         }
      }

      low.reDim(num());
      up.reDim(num());
      object.reDim(num());
      scaleExp.reSize(num());
   }